

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

idx_t __thiscall duckdb::Binder::GenerateTableIndex(Binder *this)

{
  idx_t iVar1;
  Binder *pBVar2;
  
  pBVar2 = GetRootBinder(this);
  iVar1 = pBVar2->bound_tables;
  pBVar2->bound_tables = iVar1 + 1;
  return iVar1;
}

Assistant:

idx_t Binder::GenerateTableIndex() {
	auto &root_binder = GetRootBinder();
	return root_binder.bound_tables++;
}